

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O0

void __thiscall level_aux_mesh::create_uvs(level_aux_mesh *this)

{
  bool bVar1;
  reference pvVar2;
  pointer pbVar3;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_20;
  b_face_vec_it end;
  b_face_vec_it it;
  level_aux_mesh *this_local;
  
  std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::resize
            (&(this->super_xr_mesh_builder).m_texcoords,3);
  pvVar2 = std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).m_texcoords,0);
  xray_re::_vector2<float>::set(pvVar2,0.0,0.0);
  pvVar2 = std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).m_texcoords,1);
  xray_re::_vector2<float>::set(pvVar2,0.0,1.0);
  pvVar2 = std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).m_texcoords,2);
  xray_re::_vector2<float>::set(pvVar2,1.0,0.0);
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&(this->super_xr_mesh_builder).m_faces);
  local_20._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       end(&(this->super_xr_mesh_builder).m_faces);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_20);
    if (!bVar1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    (pbVar3->field_0).field_0.tc[0] = 0;
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    (pbVar3->field_0).field_0.tc[1] = 1;
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    (pbVar3->field_0).field_0.tc[2] = 2;
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

void level_aux_mesh::create_uvs()
{
	m_texcoords.resize(3);
	m_texcoords[0].set(0.f, 0.f);
	m_texcoords[1].set(0.f, 1.f);
	m_texcoords[2].set(1.f, 0.f);
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it) {
		it->tc0 = 0;
		it->tc1 = 1;
		it->tc2 = 2;
	}
}